

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3VectorFieldSubexpr(Expr *pVector,int i)

{
  u8 uVar1;
  u8 uVar2;
  Select *pSVar3;
  
  uVar1 = pVector->op;
  uVar2 = uVar1;
  if (uVar1 == 0xb0) {
    uVar2 = pVector->op2;
  }
  pSVar3 = (Select *)pVector;
  if (uVar2 != 0xb1) {
    if (uVar2 != 0x8b) {
      return pVector;
    }
    pSVar3 = (pVector->x).pSelect;
  }
  if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar3->pEList)->pList->nExpr) {
    if ((uVar1 == 0x8b) || (pVector->op2 == 0x8b)) {
      pVector = (Expr *)(pVector->x).pSelect;
    }
    pVector = ((anon_union_8_2_a01b6dbf_for_x *)&((Select *)pVector)->pEList)->pList->a[i].pExpr;
  }
  return pVector;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3VectorFieldSubexpr(Expr *pVector, int i){
  assert( i<sqlite3ExprVectorSize(pVector) || pVector->op==TK_ERROR );
  if( sqlite3ExprIsVector(pVector) ){
    assert( pVector->op2==0 || pVector->op==TK_REGISTER );
    if( pVector->op==TK_SELECT || pVector->op2==TK_SELECT ){
      assert( ExprUseXSelect(pVector) );
      return pVector->x.pSelect->pEList->a[i].pExpr;
    }else{
      assert( ExprUseXList(pVector) );
      return pVector->x.pList->a[i].pExpr;
    }
  }
  return pVector;
}